

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_dr_flac_ogg__read_page_header
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_ogg_page_header *pHeader
                    ,ma_uint32 *pBytesRead,ma_uint32 *pCRC32)

{
  ma_result mVar1;
  size_t sVar2;
  ma_uint8 id [4];
  undefined4 local_3c;
  ma_dr_flac_ogg_page_header *local_38;
  
  *pBytesRead = 0;
  sVar2 = (*onRead)(pUserData,&local_3c,4);
  mVar1 = MA_AT_END;
  if (sVar2 == 4) {
    *pBytesRead = *pBytesRead + 4;
    local_38 = pHeader;
    if (local_3c != 0x5367674f) {
      do {
        local_3c = CONCAT13((char)((uint)local_3c >> 0x18),local_3c._1_3_);
        sVar2 = (*onRead)(pUserData,(void *)((long)&local_3c + 3),1);
        if (sVar2 != 1) {
          return MA_AT_END;
        }
        *pBytesRead = *pBytesRead + 1;
      } while (local_3c != 0x5367674f);
    }
    *pCRC32 = 0x5fb0a94f;
    mVar1 = ma_dr_flac_ogg__read_page_header_after_capture_pattern
                      (onRead,pUserData,local_38,pBytesRead,pCRC32);
  }
  return mVar1;
}

Assistant:

static ma_result ma_dr_flac_ogg__read_page_header(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_ogg_page_header* pHeader, ma_uint32* pBytesRead, ma_uint32* pCRC32)
{
    ma_uint8 id[4];
    *pBytesRead = 0;
    if (onRead(pUserData, id, 4) != 4) {
        return MA_AT_END;
    }
    *pBytesRead += 4;
    for (;;) {
        if (ma_dr_flac_ogg__is_capture_pattern(id)) {
            ma_result result;
            *pCRC32 = MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32;
            result = ma_dr_flac_ogg__read_page_header_after_capture_pattern(onRead, pUserData, pHeader, pBytesRead, pCRC32);
            if (result == MA_SUCCESS) {
                return MA_SUCCESS;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    continue;
                } else {
                    return result;
                }
            }
        } else {
            id[0] = id[1];
            id[1] = id[2];
            id[2] = id[3];
            if (onRead(pUserData, &id[3], 1) != 1) {
                return MA_AT_END;
            }
            *pBytesRead += 1;
        }
    }
}